

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUHal.cpp
# Opt level: O2

bool __thiscall
RTIMUHal::HALRead(RTIMUHal *this,uchar slaveAddr,uchar length,uchar *data,char *errorMsg)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  uint uVar4;
  char *__format;
  uint uVar5;
  uchar rxBuff [256];
  undefined1 local_138 [264];
  
  if (this->m_busIsI2C == true) {
    bVar1 = I2CSelectSlave(this,slaveAddr,errorMsg);
    uVar4 = 0;
    if (!bVar1) goto LAB_0010ff72;
    uVar5 = 0;
    while( true ) {
      iVar2 = length - uVar5;
      if ((iVar2 == 0 || (int)(uint)length < (int)uVar5) || (4 < uVar4)) break;
      sVar3 = read(this->m_I2C,data + uVar5,(long)iVar2);
      if ((int)sVar3 < 0) {
        if (*errorMsg == '\0') goto LAB_0010ff70;
        __format = "I2C read error from %d - %s\n";
        goto LAB_0010ff9d;
      }
      uVar5 = uVar5 + (int)sVar3;
      if (uVar5 == length) goto LAB_0010ff1c;
      usleep(10000);
      uVar4 = uVar4 + 1;
    }
    uVar4 = 1;
    if ((int)(uint)length <= (int)uVar5) goto LAB_0010ff72;
    if (*errorMsg != '\0') {
      __format = "I2C read from %d failed - %s\n";
LAB_0010ff9d:
      uVar4 = 0;
      fprintf(_stderr,__format,(ulong)slaveAddr,errorMsg);
      goto LAB_0010ff72;
    }
  }
  else {
    iVar2 = ioctl(this->m_SPI,0x40206b00);
    if (-1 < iVar2) {
      memcpy(data,local_138,(ulong)length);
LAB_0010ff1c:
      uVar4 = 1;
      goto LAB_0010ff72;
    }
    if (*errorMsg != '\0') {
      uVar4 = 0;
      fprintf(_stderr,"SPI read error from - %s\n",errorMsg);
      goto LAB_0010ff72;
    }
  }
LAB_0010ff70:
  uVar4 = 0;
LAB_0010ff72:
  return SUB41(uVar4,0);
}

Assistant:

bool RTIMUHal::HALRead(unsigned char slaveAddr, unsigned char length,
                    unsigned char *data, const char *errorMsg)
{
    int tries, result, total;
    unsigned char rxBuff[MAX_READ_LEN + 1];
    struct spi_ioc_transfer rdIOC;

    if (m_busIsI2C) {
        if (!I2CSelectSlave(slaveAddr, errorMsg))
            return false;

        total = 0;
        tries = 0;

        while ((total < length) && (tries < 5)) {
            result = read(m_I2C, data + total, length - total);

            if (result < 0) {
                if (strlen(errorMsg) > 0)
                    HAL_ERROR2("I2C read error from %d - %s\n", slaveAddr, errorMsg);
                return false;
            }

            total += result;

            if (total == length)
                break;

            delayMs(10);
            tries++;
        }

        if (total < length) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR2("I2C read from %d failed - %s\n", slaveAddr, errorMsg);
            return false;
        }
    } else {
        memset(&rdIOC, 0, sizeof(rdIOC));
        rdIOC.tx_buf = 0;
        rdIOC.rx_buf = (unsigned long) rxBuff;
        rdIOC.len = length;

        if (ioctl(m_SPI, SPI_IOC_MESSAGE(1), &rdIOC) < 0) {
            if (strlen(errorMsg) > 0)
                HAL_ERROR1("SPI read error from - %s\n", errorMsg);
            return false;
        }
        memcpy(data, rxBuff, length);
    }
    return true;
}